

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

bool __thiscall TSMuxer::doFlush(TSMuxer *this,int64_t newPCR,int64_t pcrGAP)

{
  int iVar1;
  uint uVar2;
  MuxerManager *this_00;
  uint8_t *buff;
  int iVar3;
  uint8_t *__dest;
  long lVar4;
  uint uVar5;
  ulong __n;
  
  writePESPacket(this);
  iVar1 = (this->super_AbstractMuxer).m_sectorSize;
  if (0 < (long)iVar1) {
    lVar4 = this->m_processedBlockSize % (long)iVar1;
    iVar3 = 0;
    if (lVar4 != 0) {
      iVar3 = iVar1 - (int)lVar4;
    }
    writeNullPackets(this,iVar3 / this->m_frameSize);
  }
  if (this->m_m2tsMode == true) {
    processM2TSPCR(this,newPCR,pcrGAP);
  }
  uVar2 = this->m_outBufLen;
  uVar5 = uVar2 & 0x7ff;
  __n = (ulong)uVar5;
  this_00 = (this->super_AbstractMuxer).m_owner;
  if (this_00->m_asyncMode == true) {
    if (uVar5 == 0) {
      MuxerManager::asyncWriteBuffer
                (this_00,&this->super_AbstractMuxer,this->m_outBuf,uVar2 & 0xfffff800,
                 this->m_muxFile);
      this->m_outBuf = (uint8_t *)0x0;
    }
    else {
      if ((this->super_AbstractMuxer).m_sectorSize != 0) {
        __assert_fail("m_sectorSize == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                      ,0x1b4,"bool TSMuxer::doFlush(const int64_t, const int64_t)");
      }
      __dest = (uint8_t *)operator_new__(__n);
      buff = this->m_outBuf;
      memcpy(__dest,buff + ((long)(int)uVar2 & 0xfffffffffffff800U),__n);
      MuxerManager::asyncWriteBuffer
                (this_00,&this->super_AbstractMuxer,buff,uVar2 & 0xfffff800,this->m_muxFile);
      this->m_outBuf = __dest;
    }
  }
  else {
    MuxerManager::syncWriteBuffer
              (this_00,&this->super_AbstractMuxer,this->m_outBuf,uVar2 & 0xfffff800,this->m_muxFile)
    ;
    memmove(this->m_outBuf,this->m_outBuf + (int)((long)(int)uVar2 & 0xfffffffffffff800U),__n);
  }
  this->m_outBufLen = uVar5;
  if (((this->super_AbstractMuxer).m_sectorSize != 0) && (uVar5 != 0)) {
    __assert_fail("!m_sectorSize || m_outBufLen == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/tsMuxer.cpp"
                  ,0x1c6,"bool TSMuxer::doFlush(const int64_t, const int64_t)");
  }
  return true;
}

Assistant:

bool TSMuxer::doFlush(const int64_t newPCR, const int64_t pcrGAP)
{
    flushTSFrame();

    if (m_sectorSize > 0)
    {
        // round file to sector size. It's also can be applied to any file in a m2ts mode
        int nullCnt = 0;
        if (m_processedBlockSize % m_sectorSize)
            nullCnt = m_sectorSize - static_cast<int>(m_processedBlockSize % m_sectorSize);
        writeNullPackets(nullCnt / m_frameSize);
    }

    if (m_m2tsMode)
        processM2TSPCR(newPCR, pcrGAP);

    const int lastBlockSize = m_outBufLen & (MuxerManager::PHYSICAL_SECTOR_SIZE - 1);  // last 64K of data
    const int roundBufLen = m_outBufLen & ~(MuxerManager::PHYSICAL_SECTOR_SIZE - 1);
    if (m_owner->isAsyncMode())
    {
        if (lastBlockSize > 0)
        {
            assert(m_sectorSize == 0);  // we should not be here in interleaved mode!
            const auto newBuff = new uint8_t[lastBlockSize];
            memcpy(newBuff, m_outBuf + roundBufLen, lastBlockSize);
            m_owner->asyncWriteBuffer(this, m_outBuf, roundBufLen, m_muxFile);
            m_outBuf = newBuff;
        }
        else
        {
            m_owner->asyncWriteBuffer(this, m_outBuf, roundBufLen, m_muxFile);
            m_outBuf = nullptr;
        }
    }
    else
    {
        m_owner->syncWriteBuffer(this, m_outBuf, roundBufLen, m_muxFile);
        memmove(m_outBuf, m_outBuf + roundBufLen, lastBlockSize);
    }
    m_outBufLen = lastBlockSize;
    assert(!m_sectorSize || m_outBufLen == 0);
    return true;
}